

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

timestamp_t __thiscall
duckdb::TimeBucket::WidthConvertibleToMicrosBinaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (WidthConvertibleToMicrosBinaryOperator *this,interval_t bucket_width,timestamp_t ts)

{
  bool bVar1;
  int64_t bucket_width_micros;
  timestamp_t tVar2;
  int64_t ts_micros;
  WidthConvertibleToMicrosBinaryOperator *local_20;
  int64_t local_18;
  
  tVar2.value = bucket_width.micros;
  local_18 = bucket_width._0_8_;
  local_20 = this;
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(tVar2);
  if (bVar1) {
    bucket_width_micros = Interval::GetMicro((interval_t *)&local_20);
    tVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(tVar2);
    ts_micros = Timestamp::GetEpochMicroSeconds(tVar2);
    tVar2 = WidthConvertibleToMicrosCommon(bucket_width_micros,ts_micros,0x35d2976e6a000);
    tVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(tVar2);
    return (timestamp_t)tVar2.value;
  }
  tVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(tVar2);
  return (timestamp_t)tVar2.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(ts));
			return Cast::template Operation<timestamp_t, TR>(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, DEFAULT_ORIGIN_MICROS));
		}